

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::value_type::move<int>(value_type *this,self_type *that)

{
  int *piVar1;
  
  piVar1 = as<int>(that);
  if (this->yytypeid_ == (type_info *)0x0) {
    this->yytypeid_ = (type_info *)&int::typeinfo;
    *(int *)&this->field_0 = *piVar1;
    as<int>(that);
    that->yytypeid_ = (type_info *)0x0;
    return;
  }
  __assert_fail("!yytypeid_",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.hh"
                ,0x110,
                "T &tchecker::parsing::system::parser_t::value_type::emplace(U &&...) [T = int, U = <int>]"
               );
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }